

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O1

void __thiscall memt::Arena::Guard::~Guard(Guard *this)

{
  char *pcVar1;
  Block *this_00;
  
  this_00 = (Block *)this->mArena;
  if (this_00 != (Block *)0x0) {
    pcVar1 = (char *)this->mPosition;
    if (pcVar1 == (char *)0x0) {
      freeAllAllocs((Arena *)this_00);
    }
    else {
      for (; (pcVar1 <= this_00->_begin || (this_00->_end < pcVar1)); this_00 = this_00->_previous)
      {
        this_00->_position = this_00->_begin;
      }
      this_00->_position = pcVar1;
    }
  }
  return;
}

Assistant:

~Guard() {
		if (mArena != 0)
		  mArena->restoreToGuardPoint(mPosition);
	  }